

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeLSRKStepMem step_mem;
  int retval;
  ARKodeLSRKStepMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  
  iVar1 = lsrkStep_AccessStepMem
                    (in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_ECX == 0) {
    if (in_RDI->fn_is_current == 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)
                        (in_XMM0_Qa,in_RSI,in_RDX,in_RDI->user_data);
      in_stack_ffffffffffffffc8->reltol = (sunrealtype)((long)in_stack_ffffffffffffffc8->reltol + 1)
      ;
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x197,"lsrkStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
  }
  else if (in_ECX == 1) {
    if (*(int *)((long)&in_stack_ffffffffffffffc8->step_mem + 4) != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)
                        (in_XMM0_Qa,in_RSI,in_RDI->fn,in_RDI->user_data);
      in_stack_ffffffffffffffc8->reltol = (sunrealtype)((long)in_stack_ffffffffffffffc8->reltol + 1)
      ;
      in_RDI->fn_is_current = 1;
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x1ab,"lsrkStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    N_VScale(0x3ff0000000000000,in_RDI->fn,in_RDX);
  }
  else {
    if (in_ECX != 2) {
      arkProcessError(in_RDI,-8,0x1c4,"lsrkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"Unknown full RHS mode");
      return -8;
    }
    iVar1 = (*(code *)in_stack_ffffffffffffffc8->sunctx)(in_XMM0_Qa,in_RSI,in_RDX,in_RDI->user_data)
    ;
    in_stack_ffffffffffffffc8->reltol = (sunrealtype)((long)in_stack_ffffffffffffffc8->reltol + 1);
    if (iVar1 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x1bb,"lsrkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,
                      "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                     );
      return -8;
    }
  }
  return 0;
}

Assistant:

int lsrkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the RHS */
    if (!ark_mem->fn_is_current)
    {
      retval = step_mem->fe(t, y, f, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }

    break;

  case ARK_FULLRHS_END:
    /* No further action is needed if STS since the currently available STS methods
       evaluate the RHS at the end of each time step. If the stepper is an SSP, fn is
       updated and reused at the beginning of the step unless
       ark_mem->fn_is_current is changed by ARKODE. */
    if (step_mem->is_SSP)
    {
      retval = step_mem->fe(t, y, ark_mem->fn, ark_mem->user_data);
      step_mem->nfe++;
      ark_mem->fn_is_current = SUNTRUE;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }
    N_VScale(ONE, ark_mem->fn, f);

    break;

  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->fe(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return ARK_RHSFUNC_FAIL;
  }

  return ARK_SUCCESS;
}